

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astro.cpp
# Opt level: O0

UDate __thiscall icu_63::CalendarAstronomer::getSunRiseSet(CalendarAstronomer *this,UBool rise)

{
  UDate aTime;
  int iVar1;
  double dVar2;
  UDate UVar3;
  double t;
  RiseSetCoordFunc func;
  double noon;
  UDate t0;
  UBool rise_local;
  CalendarAstronomer *this_local;
  
  aTime = this->fTime;
  dVar2 = ClockMath::floorDivide(this->fTime + this->fGmtOffset,86400000.0);
  func.super_CoordFunc._vptr_CoordFunc =
       (CoordFunc)((dVar2 * 86400000.0 - this->fGmtOffset) + 43200000.0);
  iVar1 = 21600000;
  if (rise != '\0') {
    iVar1 = -21600000;
  }
  setTime(this,(double)func.super_CoordFunc._vptr_CoordFunc + (double)iVar1);
  RiseSetCoordFunc::RiseSetCoordFunc((RiseSetCoordFunc *)&t);
  UVar3 = riseOrSet(this,(CoordFunc *)&t,rise,0.009302604913129777,0.009890199094634533,5000.0);
  setTime(this,aTime);
  RiseSetCoordFunc::~RiseSetCoordFunc((RiseSetCoordFunc *)&t);
  return UVar3;
}

Assistant:

UDate CalendarAstronomer::getSunRiseSet(UBool rise)
{
    UDate t0 = fTime;

    // Make a rough guess: 6am or 6pm local time on the current day
    double noon = ClockMath::floorDivide(fTime + fGmtOffset, (double)DAY_MS)*DAY_MS - fGmtOffset + (12*HOUR_MS);

    U_DEBUG_ASTRO_MSG(("Noon=%.2lf, %sL, gmtoff %.2lf\n", noon, debug_astro_date(noon+fGmtOffset), fGmtOffset));
    setTime(noon +  ((rise ? -6 : 6) * HOUR_MS));
    U_DEBUG_ASTRO_MSG(("added %.2lf ms as a guess,\n", ((rise ? -6. : 6.) * HOUR_MS)));

    RiseSetCoordFunc func;
    double t = riseOrSet(func,
                         rise,
                         .533 * DEG_RAD,        // Angular Diameter
                         34. /60.0 * DEG_RAD,    // Refraction correction
                         MINUTE_MS / 12.);       // Desired accuracy

    setTime(t0);
    return t;
}